

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O3

void duckdb::RadixScatterStringVector
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  idx_t s;
  ulong uVar5;
  idx_t iVar6;
  void *pvVar7;
  undefined3 in_register_00000089;
  ulong uVar8;
  undefined8 local_40;
  void *local_38;
  
  pdVar1 = vdata->data;
  if (CONCAT31(in_register_00000089,has_null) == 0) {
    if (add_count != 0) {
      uVar8 = 0;
      do {
        uVar5 = uVar8;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)sel->sel_vector[uVar8];
        }
        psVar2 = vdata->sel->sel_vector;
        if (psVar2 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar2[uVar5];
        }
        pdVar4 = key_locations[uVar8];
        local_40 = *(ulong *)(pdVar1 + uVar5 * 0x10 + offset * 0x10);
        local_38 = *(void **)(pdVar1 + uVar5 * 0x10 + offset * 0x10 + 8);
        uVar5 = local_40 & 0xffffffff;
        pvVar7 = local_38;
        if ((uint)local_40 < 0xd) {
          pvVar7 = (void *)((long)&local_40 + 4);
        }
        iVar6 = prefix_len;
        if (uVar5 < prefix_len) {
          iVar6 = uVar5;
        }
        switchD_00b041bd::default(pdVar4,pvVar7,iVar6);
        if (uVar5 <= prefix_len && prefix_len - uVar5 != 0) {
          switchD_00569a20::default(pdVar4 + uVar5,0,prefix_len - uVar5);
        }
        if (prefix_len != 0 && desc) {
          iVar6 = 0;
          do {
            key_locations[uVar8][iVar6] = ~key_locations[uVar8][iVar6];
            iVar6 = iVar6 + 1;
          } while (prefix_len != iVar6);
        }
        key_locations[uVar8] = key_locations[uVar8] + prefix_len;
        uVar8 = uVar8 + 1;
      } while (uVar8 != add_count);
    }
  }
  else if (add_count != 0) {
    uVar8 = 0;
    do {
      uVar5 = uVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar8];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar2[uVar5];
      }
      uVar5 = uVar5 + offset;
      puVar3 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
        *key_locations[uVar8] = nulls_first;
        pdVar4 = key_locations[uVar8];
        local_40 = *(ulong *)(pdVar1 + uVar5 * 0x10);
        local_38 = *(void **)(pdVar1 + uVar5 * 0x10 + 8);
        uVar5 = local_40 & 0xffffffff;
        pvVar7 = local_38;
        if ((uint)local_40 < 0xd) {
          pvVar7 = (void *)((long)&local_40 + 4);
        }
        iVar6 = prefix_len;
        if (uVar5 < prefix_len) {
          iVar6 = uVar5;
        }
        switchD_00b041bd::default(pdVar4 + 1,pvVar7,iVar6);
        if (uVar5 <= prefix_len && prefix_len - uVar5 != 0) {
          switchD_00569a20::default(pdVar4 + 1 + uVar5,0,prefix_len - uVar5);
        }
        if (prefix_len - 1 < 0xfffffffffffffffe && desc) {
          iVar6 = 0;
          do {
            key_locations[uVar8][iVar6 + 1] = ~key_locations[uVar8][iVar6 + 1];
            iVar6 = iVar6 + 1;
          } while (prefix_len != iVar6);
        }
      }
      else {
        *key_locations[uVar8] = !nulls_first;
        switchD_00569a20::default(key_locations[uVar8] + 1,0,prefix_len);
      }
      key_locations[uVar8] = key_locations[uVar8] + prefix_len + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != add_count);
  }
  return;
}

Assistant:

void RadixScatterStringVector(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                              data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                              const idx_t prefix_len, idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<string_t>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeStringDataPrefix(key_locations[i] + 1, source[source_idx], prefix_len);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < prefix_len + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', prefix_len);
			}
			key_locations[i] += prefix_len + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeStringDataPrefix(key_locations[i], source[source_idx], prefix_len);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < prefix_len; s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += prefix_len;
		}
	}
}